

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cProgramInterfaceQueryTests.cpp
# Opt level: O1

string * __thiscall
glcts::(anonymous_namespace)::TopLevelArray::ComputeShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "layout(local_size_x = 1, local_size_y = 1) in; \nlayout(std430) buffer Outp {                   \n   mediump vec4 d;                             \n} g_out;                                       \nbuffer Block {                       \n   mediump vec4 a[5][4][3];          \n};                                   \nvoid main(void)                      \n{                                    \n    g_out.d = a[0][0][0];            \n}"
             ,"");
  return __return_storage_ptr__;
}

Assistant:

virtual std::string ComputeShader()
	{
		return "layout(local_size_x = 1, local_size_y = 1) in; \n"
			   "layout(std430) buffer Outp {                   \n"
			   "   mediump vec4 d;                             \n"
			   "} g_out;                                       \n"
			   ""
			   "buffer Block {                       \n"
			   "   mediump vec4 a[5][4][3];          \n"
			   "};                                   \n"
			   ""
			   "void main(void)                      \n"
			   "{                                    \n"
			   "    g_out.d = a[0][0][0];            \n"
			   "}";
	}